

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFactory.h
# Opt level: O2

VRGraphicsToolkit * __thiscall
MinVR::VRFactory::create<MinVR::VRGraphicsToolkit>
          (VRFactory *this,VRMainInterface *vrMain,VRDataIndex *config,string *dataContainer)

{
  VRGraphicsToolkit *pVVar1;
  pointer __rhs;
  pointer ppVVar2;
  string helpmsg;
  string typeStr;
  allocator<char> local_f6;
  allocator<char> local_f5;
  int local_f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVVar2 = (this->_itemFactories).
            super__Vector_base<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if ((this->_itemFactories).
        super__Vector_base<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>._M_impl.
        super__Vector_impl_data._M_finish <= ppVVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"N5MinVR17VRGraphicsToolkitE",(allocator<char> *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "This might be caused by a typo in your config file where the subtype (inputdeviceType, displaynodeType, etc) is specified.\n"
                 ,(allocator<char> *)&local_f4);
      std::operator+(&local_90,&local_b0,"Or if ");
      std::operator+(&local_f0,&local_90,&local_50);
      std::operator+(&local_d0,&local_f0,
                     " is provided by a plugin, there might have been a problem loading that plugin.\n"
                    );
      std::operator+(&local_70,&local_d0,"VRFactory is currently aware of the following types:");
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      for (__rhs = (this->_registeredTypes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __rhs < (this->_registeredTypes).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
        std::operator+(&local_f0,"  ",__rhs);
        std::operator+(&local_d0,&local_f0,"\n");
        std::__cxx11::string::append((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      std::operator+(&local_f0,
                     "VRFactory was unable to create Nothing in the factory catalog with the type ("
                     ,&local_50);
      std::operator+(&local_d0,&local_f0,") and subtype you specified.");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/main/VRFactory.h"
                 ,&local_f5);
      local_f4 = 0x4b;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "T *MinVR::VRFactory::create(VRMainInterface *, VRDataIndex *, const std::string &) [T = MinVR::VRGraphicsToolkit]"
                 ,&local_f6);
      VRError::VRWarning(&local_d0,&local_70,&local_90,&local_f4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return (VRGraphicsToolkit *)0x0;
    }
    pVVar1 = VRItemFactory::createItem<MinVR::VRGraphicsToolkit>
                       (*ppVVar2,vrMain,config,dataContainer);
    ppVVar2 = ppVVar2 + 1;
  } while (pVVar1 == (VRGraphicsToolkit *)0x0);
  return pVVar1;
}

Assistant:

T* VRFactory::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {

  // Run through all the items in the factory trying to generate something of the
  // correct type.
  for (std::vector<VRItemFactory*>::iterator it = _itemFactories.begin();
       it < _itemFactories.end(); ++it) {

    T* item = (*it)->createItem<T>(vrMain, config, dataContainer);
    if (item != NULL) {
      // Success; we have created something.  Return it.
      return item;
    }
  }

  // Issue a warning here, but we assume the caller will issue an error when it
  // gets a NULL back.  We let the caller kill off the process because it has more
  // information with which to make a decent error message.
  std::string typeStr = std::string(typeid(T).name());
  std::string helpmsg = std::string("This might be caused by a typo in your config file where the subtype (inputdeviceType, displaynodeType, etc) is specified.\n") + 
    "Or if " + typeStr + " is provided by a plugin, there might have been a problem loading that plugin.\n" +
    "VRFactory is currently aware of the following types:";
  for (std::vector<std::string>::iterator it = _registeredTypes.begin(); it < _registeredTypes.end(); ++it) {
    helpmsg += "  " + *it + "\n";
  } 
  VRWARNING("VRFactory was unable to create Nothing in the factory catalog with the type (" +
          typeStr + ") and subtype you specified.", helpmsg);

  // Return NULL to indicate failure.
  return NULL;
}